

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
 __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::connectToIntroduced
          (ConnectionImpl *this,Reader contact,Builder completion)

{
  undefined8 uVar1;
  bool bVar2;
  uint64_t value;
  socklen_t __len;
  char *pcVar3;
  sockaddr *__addr;
  Connection *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
  MVar4;
  Reader local_a0;
  bool local_69;
  undefined1 auStack_68 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_58;
  undefined1 local_48 [8];
  DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> _kjCondition;
  ConnectionImpl *this_local;
  
  _auStack_68 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestThirdPartyToContact::Reader::getSentBy(&contact);
  local_58 = (ArrayPtr<const_char>)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)auStack_68);
  pcVar3 = local_58.ptr;
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> *)local_48,
             (DebugExpression<capnp::Text::Reader> *)&local_58,(StringPtr *)(in_RSI + 0xb8));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  __len = (socklen_t)pcVar3;
  if (!bVar2) {
    local_69 = kj::_::Debug::shouldLog(ERROR);
    while (__len = (socklen_t)pcVar3, local_69 != false) {
      pcVar3 = "\"failed: expected \" \"contact.getSentBy() == partnerName\", _kjCondition";
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x1f2,ERROR,
                 "\"failed: expected \" \"contact.getSentBy() == partnerName\", _kjCondition",
                 (char (*) [52])"failed: expected contact.getSentBy() == partnerName",
                 (DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> *)local_48);
      local_69 = false;
    }
  }
  value = capnproto_test::capnp::test::TestThirdPartyToContact::Reader::getToken(&contact);
  capnproto_test::capnp::test::TestThirdPartyCompletion::Builder::setToken(&completion,value);
  uVar1 = *(undefined8 *)(in_RSI + 0x20);
  capnproto_test::capnp::test::TestThirdPartyToContact::Reader::getPath(&local_a0,&contact);
  connect((TestVat *)this,(int)uVar1,__addr,__len);
  MVar4.ptr.ptr = extraout_RDX;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
          )MVar4.ptr;
}

Assistant:

kj::Maybe<kj::Own<Connection>> connectToIntroduced(
        test::TestThirdPartyToContact::Reader contact,
        test::TestThirdPartyCompletion::Builder completion) override {
      KJ_EXPECT(contact.getSentBy() == partnerName);
      completion.setToken(contact.getToken());
      return vat.connect(contact.getPath());
    }